

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

DWord __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::InMillisecondsFromNow
          (KernelTimeout *this)

{
  bool bVar1;
  ulong uVar2;
  uint64_t ms_from_now;
  uint64_t ns_from_now;
  uint64_t kMaxValueNanos;
  uint64_t kNanosInMillis;
  DWord kInfinite;
  KernelTimeout *this_local;
  
  bVar1 = has_timeout(this);
  if (bVar1) {
    uVar2 = InNanosecondsFromNow(this);
    if (uVar2 < 0x7ffffffffff0bdc0) {
      this_local = (KernelTimeout *)((uVar2 + 999999) / 1000000);
    }
    else {
      this_local = (KernelTimeout *)0xffffffffffffffff;
    }
  }
  else {
    this_local = (KernelTimeout *)0xffffffffffffffff;
  }
  return (DWord)this_local;
}

Assistant:

KernelTimeout::DWord KernelTimeout::InMillisecondsFromNow() const {
  constexpr DWord kInfinite = std::numeric_limits<DWord>::max();

  if (!has_timeout()) {
    return kInfinite;
  }

  constexpr uint64_t kNanosInMillis = uint64_t{1'000'000};
  constexpr uint64_t kMaxValueNanos =
      std::numeric_limits<int64_t>::max() - kNanosInMillis + 1;

  uint64_t ns_from_now = static_cast<uint64_t>(InNanosecondsFromNow());
  if (ns_from_now >= kMaxValueNanos) {
    // Rounding up would overflow.
    return kInfinite;
  }
  // Convert to milliseconds, always rounding up.
  uint64_t ms_from_now = (ns_from_now + kNanosInMillis - 1) / kNanosInMillis;
  if (ms_from_now > kInfinite) {
    return kInfinite;
  }
  return static_cast<DWord>(ms_from_now);
}